

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  pointer noncefp;
  bool bVar1;
  int iVar2;
  secp256k1_context_struct *ctx_00;
  uchar *puVar3;
  undefined8 uVar4;
  CfdException *this;
  uchar *ndata_00;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  size_type in_stack_fffffffffffffdd8;
  CfdError CVar5;
  CfdException *in_stack_fffffffffffffde0;
  secp256k1_nonce_function_hardened local_1f0;
  ByteData local_1a8;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [39];
  byte local_161;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined1 local_128 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  secp256k1_nonce_function_hardened nfn;
  string local_100 [48];
  ByteData local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  int local_9c;
  undefined1 local_98 [4];
  int ret;
  secp256k1_keypair keypair;
  secp256k1_context_struct *ctx;
  ByteData *ndata_local;
  secp256k1_nonce_function_hardened *nonce_fn_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  ctx_00 = wally_get_secp_context();
  keypair.data._88_8_ = ctx_00;
  Privkey::GetData(&local_d0,sk);
  ByteData::GetBytes(&local_b8,&local_d0);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x48e533);
  iVar2 = secp256k1_keypair_create(ctx_00,(secp256k1_keypair *)local_98,puVar3);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  ByteData::~ByteData((ByteData *)0x48e569);
  local_9c = iVar2;
  if (iVar2 != 1) {
    nfn._6_1_ = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    CVar5 = (CfdError)(in_stack_fffffffffffffdd8 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_100,"Could not create keypair.",(allocator *)((long)&nfn + 7));
    CfdException::CfdException
              (in_stack_fffffffffffffde0,CVar5,
               (string *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    nfn._6_1_ = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    local_1f0 = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    local_1f0 = *nonce_fn;
  }
  raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1f0;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x48e6e7);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x48e70d);
  uVar4 = keypair.data._88_8_;
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x48e724);
  ByteData256::GetBytes(&local_148,msg);
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x48e749);
  noncefp = raw_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_161 = 0;
  bVar1 = ByteData::IsEmpty(ndata);
  if (bVar1) {
    ndata_00 = (uchar *)0x0;
  }
  else {
    ByteData::GetBytes(&local_160,ndata);
    local_161 = 1;
    ndata_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x48e7b8);
  }
  iVar2 = secp256k1_schnorrsig_sign
                    ((secp256k1_context *)uVar4,puVar3,(uchar *)this,(secp256k1_keypair *)local_98,
                     (secp256k1_nonce_function_hardened)noncefp,ndata_00);
  CVar5 = (CfdError)((ulong)ndata_00 >> 0x20);
  local_9c = iVar2;
  if ((local_161 & 1) != 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(iVar2,in_stack_fffffffffffffdd0));
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar2,in_stack_fffffffffffffdd0));
  if (local_9c == 1) {
    ByteData::ByteData(&local_1a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128
                      );
    SchnorrSignature::SchnorrSignature(__return_storage_ptr__,&local_1a8);
    ByteData::~ByteData((ByteData *)0x48e9d0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(iVar2,in_stack_fffffffffffffdd0));
    return __return_storage_ptr__;
  }
  local_18a = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_188,"Could not create Schnorr signature.",&local_189);
  CfdException::CfdException(this,CVar5,(string *)CONCAT44(iVar2,in_stack_fffffffffffffdd0));
  local_18a = 0;
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  ret = secp256k1_schnorrsig_sign(
      ctx, raw_sig.data(), msg.GetBytes().data(), &keypair, nfn,
      (ndata.IsEmpty()) ? nullptr : ndata.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}